

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O1

void __thiscall Array1dTest_AccessConst_Test::TestBody(Array1dTest_AccessConst_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  Array1d<int> a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  undefined4 local_58 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_58[0] = 2;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,5,(value_type_conflict4 *)local_58,(allocator_type *)&local_68);
  lVar2 = 0;
  do {
    local_68.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"2","a(i)",(int *)&local_68,
               (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar2));
    if (local_58[0]._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/ArrayTests.cpp"
                 ,0x34,message);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      break;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Array1dTest, AccessConst)
{
    const Array1d<int> a(5, 2);
    for (int i = 0; i < 5; i++)
        ASSERT_EQ(2, a(i));
}